

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O1

Vec_Ptr_t *
Abc_NodeCollectTfoCands(Abc_ManCut_t *p,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,int LevelMax)

{
  undefined4 uVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  int *piVar9;
  Vec_Vec_t *pVVar10;
  void *pvVar11;
  void **ppvVar12;
  uint uVar13;
  uint uVar14;
  int Fill;
  int Fill_00;
  Vec_Ptr_t *pVVar15;
  Vec_Ptr_t *extraout_RDX;
  Vec_Ptr_t *extraout_RDX_00;
  Vec_Ptr_t *extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar16;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  int iVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  
  pAVar2 = pRoot->pNtk;
  if (pAVar2->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x2c1,
                  "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  pVVar8 = (Vec_Ptr_t *)(long)p->vLevels->nSize;
  pVVar15 = vLeaves;
  if (0 < (long)pVVar8) {
    pVVar15 = (Vec_Ptr_t *)0x0;
    do {
      if (*(int *)((long)p->vLevels->pArray[(long)pVVar15] + 4) != 0) {
        __assert_fail("vVec->nSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                      ,0x2c5,
                      "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                     );
      }
      pVVar15 = (Vec_Ptr_t *)((long)&pVVar15->nCap + 1);
    } while (pVVar8 != pVVar15);
  }
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar17 = pAVar2->vObjs->nSize;
    uVar18 = (long)iVar17 + 500;
    iVar19 = (int)uVar18;
    if ((pAVar2->vTravIds).nCap < iVar19) {
      piVar9 = (int *)malloc(uVar18 * 4);
      (pAVar2->vTravIds).pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar19;
      pVVar15 = extraout_RDX;
    }
    if (-500 < iVar17) {
      memset((pAVar2->vTravIds).pArray,0,(uVar18 & 0xffffffff) << 2);
      pVVar15 = extraout_RDX_00;
    }
    (pAVar2->vTravIds).nSize = iVar19;
  }
  iVar17 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar17 + 1;
  if (0x3ffffffe < iVar17) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  uVar13 = 0xffffffff;
  if (0 < vLeaves->nSize) {
    lVar20 = 0;
    do {
      plVar3 = (long *)vLeaves->pArray[lVar20];
      if (*(uint *)((long)plVar3 + 0x14) >> 0xc <= (uint)LevelMax) {
        lVar21 = *plVar3;
        uVar1 = *(undefined4 *)(lVar21 + 0xd8);
        iVar17 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),iVar17 + 1,(int)pVVar15);
        if (((long)iVar17 < 0) || (*(int *)(lVar21 + 0xe4) <= iVar17)) {
LAB_002fcea7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar21 + 0xe8) + (long)iVar17 * 4) = uVar1;
        Vec_VecPush(p->vLevels,*(uint *)((long)plVar3 + 0x14) >> 0xc,plVar3);
        uVar7 = *(uint *)((long)plVar3 + 0x14) >> 0xc;
        pVVar15 = extraout_RDX_01;
        if ((int)uVar13 <= (int)uVar7) {
          uVar13 = uVar7;
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < vLeaves->nSize);
  }
  if ((int)uVar13 < 0) {
    __assert_fail("LevelMin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x2d3,
                  "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  Abc_NodeMffcLabelAig(pRoot);
  p->vNodesTfo->nSize = 0;
  pVVar10 = p->vLevels;
  iVar17 = pVVar10->nSize;
  if ((int)uVar13 < iVar17) {
    uVar18 = (ulong)uVar13;
    do {
      pVVar10 = p->vLevels;
      iVar17 = (int)uVar18;
      if (pVVar10->nSize <= iVar17) {
LAB_002fce88:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar20 = 0;
      while ((lVar20 < *(int *)((long)pVVar10->pArray[uVar18] + 4) && (iVar17 <= LevelMax))) {
        plVar3 = *(long **)(*(long *)((long)pVVar10->pArray[uVar18] + 8) + lVar20 * 8);
        lVar21 = *plVar3;
        iVar19 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),iVar19 + 1,(int)lVar20);
        if (((long)iVar19 < 0) || (*(int *)(lVar21 + 0xe4) <= iVar19)) {
LAB_002fce69:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar16 = extraout_RDX_02;
        if (*(int *)(*(long *)(lVar21 + 0xe8) + (long)iVar19 * 4) == *(int *)(*plVar3 + 0xd8)) {
LAB_002fcafe:
          if (0 < *(int *)((long)plVar3 + 0x2c)) {
            lVar21 = 0;
            do {
              plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)(plVar3[6] + lVar21 * 4) * 8);
              if ((*(uint *)((long)plVar4 + 0x14) >> 0xc <= (uint)LevelMax) &&
                 (1 < (*(uint *)((long)plVar4 + 0x14) & 0xf) - 3)) {
                lVar5 = *plVar4;
                iVar19 = (int)plVar4[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar19 + 1,(int)uVar16);
                if (((long)iVar19 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar19)) goto LAB_002fce69;
                uVar16 = extraout_RDX_03;
                if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar19 * 4) != *(int *)(*plVar4 + 0xd8)
                   ) {
                  pVVar10 = p->vLevels;
                  uVar7 = *(uint *)((long)plVar4 + 0x14) >> 0xc;
                  if ((int)uVar7 < pVVar10->nSize) {
                    puVar6 = (uint *)pVVar10->pArray[uVar7];
                    uVar7 = puVar6[1];
                    if (0 < (long)(int)uVar7) {
                      uVar16 = 0;
                      do {
                        if (*(long **)(*(long *)(puVar6 + 2) + uVar16 * 8) == plVar4)
                        goto LAB_002fcc5d;
                        uVar16 = uVar16 + 1;
                      } while ((long)(int)uVar7 != uVar16);
                    }
                    uVar14 = *puVar6;
                    if (uVar7 == uVar14) {
                      if ((int)uVar14 < 0x10) {
                        if (*(void **)(puVar6 + 2) == (void *)0x0) {
                          pvVar11 = malloc(0x80);
                        }
                        else {
                          pvVar11 = realloc(*(void **)(puVar6 + 2),0x80);
                        }
                        *(void **)(puVar6 + 2) = pvVar11;
                        uVar7 = 0x10;
                      }
                      else {
                        uVar7 = uVar14 * 2;
                        if ((int)uVar7 <= (int)uVar14) goto LAB_002fcc47;
                        if (*(void **)(puVar6 + 2) == (void *)0x0) {
                          pvVar11 = malloc((ulong)uVar14 << 4);
                        }
                        else {
                          pvVar11 = realloc(*(void **)(puVar6 + 2),(ulong)uVar14 << 4);
                        }
                        *(void **)(puVar6 + 2) = pvVar11;
                      }
                      *puVar6 = uVar7;
                    }
LAB_002fcc47:
                    uVar7 = puVar6[1];
                    uVar14 = uVar7 + 1;
                    uVar16 = (ulong)uVar14;
                    puVar6[1] = uVar14;
                    *(long **)(*(long *)(puVar6 + 2) + (long)(int)uVar7 * 8) = plVar4;
                  }
                  else {
                    Vec_VecPush(pVVar10,uVar7,plVar4);
                    uVar16 = extraout_RDX_04;
                  }
                }
              }
LAB_002fcc5d:
              lVar21 = lVar21 + 1;
            } while (lVar21 < *(int *)((long)plVar3 + 0x2c));
          }
        }
        else {
          plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             );
          lVar21 = *plVar4;
          iVar19 = (int)plVar4[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),iVar19 + 1,(int)extraout_RDX_02);
          if (((long)iVar19 < 0) || (*(int *)(lVar21 + 0xe4) <= iVar19)) goto LAB_002fce69;
          if (*(int *)(*(long *)(lVar21 + 0xe8) + (long)iVar19 * 4) == *(int *)(*plVar4 + 0xd8)) {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + 4) * 8);
            lVar21 = *plVar4;
            iVar19 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),iVar19 + 1,Fill);
            if (((long)iVar19 < 0) || (*(int *)(lVar21 + 0xe4) <= iVar19)) goto LAB_002fce69;
            if (*(int *)(*(long *)(lVar21 + 0xe8) + (long)iVar19 * 4) == *(int *)(*plVar4 + 0xd8)) {
              pVVar15 = p->vNodesTfo;
              uVar7 = pVVar15->nCap;
              if (pVVar15->nSize == uVar7) {
                if ((int)uVar7 < 0x10) {
                  if (pVVar15->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar12 = (void **)realloc(pVVar15->pArray,0x80);
                  }
                  pVVar15->pArray = ppvVar12;
                  iVar19 = 0x10;
                }
                else {
                  iVar19 = uVar7 * 2;
                  if (iVar19 <= (int)uVar7) goto LAB_002fcdc6;
                  if (pVVar15->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc((ulong)uVar7 << 4);
                  }
                  else {
                    ppvVar12 = (void **)realloc(pVVar15->pArray,(ulong)uVar7 << 4);
                  }
                  pVVar15->pArray = ppvVar12;
                }
                pVVar15->nCap = iVar19;
              }
LAB_002fcdc6:
              iVar19 = pVVar15->nSize;
              Fill_00 = iVar19 + 1;
              pVVar15->nSize = Fill_00;
              pVVar15->pArray[iVar19] = plVar3;
              lVar21 = *plVar3;
              uVar1 = *(undefined4 *)(lVar21 + 0xd8);
              iVar19 = (int)plVar3[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),iVar19 + 1,Fill_00);
              if ((-1 < (long)iVar19) && (iVar19 < *(int *)(lVar21 + 0xe4))) {
                *(undefined4 *)(*(long *)(lVar21 + 0xe8) + (long)iVar19 * 4) = uVar1;
                uVar16 = extraout_RDX_05;
                goto LAB_002fcafe;
              }
              goto LAB_002fcea7;
            }
          }
        }
        lVar20 = lVar20 + 1;
        pVVar10 = p->vLevels;
        if (pVVar10->nSize <= iVar17) goto LAB_002fce88;
      }
      uVar18 = uVar18 + 1;
      pVVar10 = p->vLevels;
      iVar17 = pVVar10->nSize;
    } while ((int)uVar18 < iVar17);
  }
  if ((int)uVar13 < iVar17) {
    uVar18 = (ulong)uVar13;
    do {
      if (LevelMax < (int)uVar18) break;
      *(undefined4 *)((long)pVVar10->pArray[uVar18] + 4) = 0;
      uVar18 = uVar18 + 1;
    } while ((int)uVar18 < iVar17);
  }
  return p->vNodesTfo;
}

Assistant:

Vec_Ptr_t * Abc_NodeCollectTfoCands( Abc_ManCut_t * p, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, int LevelMax )
{
    Abc_Ntk_t * pNtk = pRoot->pNtk;
    Vec_Ptr_t * vVec;
    Abc_Obj_t * pNode, * pFanout;
    int i, k, v, LevelMin;
    assert( Abc_NtkIsStrash(pNtk) );

    // assuming that the structure is clean
    Vec_VecForEachLevel( p->vLevels, vVec, i )
        assert( vVec->nSize == 0 );

    // put fanins into the structure while labeling them
    Abc_NtkIncrementTravId( pNtk );
    LevelMin = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        if ( pNode->Level > (unsigned)LevelMax )
            continue;
        Abc_NodeSetTravIdCurrent( pNode );
        Vec_VecPush( p->vLevels, pNode->Level, pNode );
        if ( LevelMin < (int)pNode->Level )
            LevelMin = pNode->Level;
    }
    assert( LevelMin >= 0 );

    // mark MFFC 
    if ( pRoot )
        Abc_NodeMffcLabelAig( pRoot );

    // go through the levels up
    Vec_PtrClear( p->vNodesTfo );
    Vec_VecForEachEntryStart( Abc_Obj_t *, p->vLevels, pNode, i, k, LevelMin )
    {
        if ( i > LevelMax )
            break;
        // if the node is not marked, it is not a fanin
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
        {
            // check if it belongs to the TFO
            if ( !Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pNode)) || 
                 !Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pNode)) )
                 continue;
            // save the node in the TFO and label it
            Vec_PtrPush( p->vNodesTfo, pNode );
            Abc_NodeSetTravIdCurrent( pNode );
        }
        // go through the fanouts and add them to the structure if they meet the conditions
        Abc_ObjForEachFanout( pNode, pFanout, v )
        {
            // skip if fanout is a CO or its level exceeds
            if ( Abc_ObjIsCo(pFanout) || pFanout->Level > (unsigned)LevelMax )
                continue;
            // skip if it is already added or if it is in MFFC
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // add it to the structure but do not mark it (until tested later)
            Vec_VecPushUnique( p->vLevels, pFanout->Level, pFanout );
        }
    }

    // clear the levelized structure
    Vec_VecForEachLevelStart( p->vLevels, vVec, i, LevelMin )
    {
        if ( i > LevelMax )
            break;
        Vec_PtrClear( vVec );
    }
    return p->vNodesTfo;
}